

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

VNode * despot::DESPOT::ConstructTree
                  (vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
                  RandomStreams *streams,ScenarioLowerBound *lower_bound,
                  ScenarioUpperBound *upper_bound,DSPOMDP *model,History *history,double timeout,
                  SearchStatistics *statistics)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppSVar4;
  VNode *this;
  log_ostream *plVar5;
  clock_t cVar6;
  VNode *vnode;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  double dVar10;
  double dVar11;
  VNode *cur;
  double start;
  double dStack_68;
  int num_trials;
  double used_time;
  VNode *root;
  int i;
  double timeout_local;
  History *history_local;
  DSPOMDP *model_local;
  ScenarioUpperBound *upper_bound_local;
  ScenarioLowerBound *lower_bound_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  
  if (statistics != (SearchStatistics *)0x0) {
    iVar2 = (*model->_vptr_DSPOMDP[0x18])();
    statistics->num_particles_before_search = iVar2;
  }
  for (root._4_4_ = 0;
      sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles),
      (ulong)(long)root._4_4_ < sVar3; root._4_4_ = root._4_4_ + 1) {
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)root._4_4_);
    (*ppSVar4)->scenario_id = root._4_4_;
  }
  this = (VNode *)operator_new(0x98);
  VNode::VNode(this,particles,0,(QNode *)0x0,0xffffffffffffffff);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
    plVar5 = logging::stream(4);
    std::operator<<(&plVar5->super_ostream,
                    "[DESPOT::ConstructTree] START - Initializing lower and upper bounds at the root node."
                   );
  }
  InitBounds(this,lower_bound,upper_bound,streams,history);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
    plVar5 = logging::stream(4);
    std::operator<<(&plVar5->super_ostream,
                    "[DESPOT::ConstructTree] END - Initializing lower and upper bounds at the root node."
                   );
  }
  if (statistics != (SearchStatistics *)0x0) {
    dVar10 = VNode::lower_bound(this);
    statistics->initial_lb = dVar10;
    dVar10 = VNode::upper_bound(this);
    statistics->initial_ub = dVar10;
  }
  dStack_68 = 0.0;
  start._4_4_ = 0;
  do {
    cVar6 = clock();
    vnode = Trial(this,streams,lower_bound,upper_bound,model,history,statistics);
    cVar7 = clock();
    cVar8 = clock();
    Backup(vnode);
    if (statistics != (SearchStatistics *)0x0) {
      cVar9 = clock();
      statistics->time_backup =
           ((double)cVar9 - (double)cVar8) / 1000000.0 + statistics->time_backup;
    }
    cVar9 = clock();
    dStack_68 = ((double)cVar9 - (double)cVar8) / 1000000.0 +
                ((double)cVar7 - (double)cVar6) / 1000000.0 + dStack_68;
    start._4_4_ = start._4_4_ + 1;
    bVar1 = false;
    if ((dStack_68 * ((double)start._4_4_ + 1.0)) / (double)start._4_4_ < timeout) {
      dVar10 = VNode::upper_bound(this);
      dVar11 = VNode::lower_bound(this);
      bVar1 = 1e-06 < dVar10 - dVar11;
    }
  } while (bVar1);
  if (statistics != (SearchStatistics *)0x0) {
    iVar2 = (*model->_vptr_DSPOMDP[0x18])();
    statistics->num_particles_after_search = iVar2;
    iVar2 = VNode::PolicyTreeSize(this);
    statistics->num_policy_nodes = iVar2;
    iVar2 = VNode::Size(this);
    statistics->num_tree_nodes = iVar2;
    dVar10 = VNode::lower_bound(this);
    statistics->final_lb = dVar10;
    dVar10 = VNode::upper_bound(this);
    statistics->final_ub = dVar10;
    statistics->time_search = dStack_68;
    statistics->num_trials = start._4_4_;
  }
  return this;
}

Assistant:

VNode* DESPOT::ConstructTree(vector<State*>& particles, RandomStreams& streams,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, History& history, double timeout,
	SearchStatistics* statistics) {
	if (statistics != NULL) {
		statistics->num_particles_before_search = model->NumActiveParticles();
	}

	for (int i = 0; i < particles.size(); i++) {
		particles[i]->scenario_id = i;
	}

	VNode* root = new VNode(particles);

	logd
		<< "[DESPOT::ConstructTree] START - Initializing lower and upper bounds at the root node.";
	InitBounds(root, lower_bound, upper_bound, streams, history);
	logd
		<< "[DESPOT::ConstructTree] END - Initializing lower and upper bounds at the root node.";

	if (statistics != NULL) {
		statistics->initial_lb = root->lower_bound();
		statistics->initial_ub = root->upper_bound();
	}

	double used_time = 0;
	int num_trials = 0;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound, upper_bound, model, history, statistics);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		if (statistics != NULL) {
			statistics->time_backup += double(clock() - start) / CLOCKS_PER_SEC;
		}
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		num_trials++;
	} while (used_time * (num_trials + 1.0) / num_trials < timeout
		&& (root->upper_bound() - root->lower_bound()) > 1e-6);

	if (statistics != NULL) {
		statistics->num_particles_after_search = model->NumActiveParticles();
		statistics->num_policy_nodes = root->PolicyTreeSize();
		statistics->num_tree_nodes = root->Size();
		statistics->final_lb = root->lower_bound();
		statistics->final_ub = root->upper_bound();
		statistics->time_search = used_time;
		statistics->num_trials = num_trials;
	}

	return root;
}